

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

base_learner * cb_explore_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  typed_option<float> *ptVar3;
  base_learner *l;
  single_learner *base;
  single_learner *psVar4;
  learner<CB_EXPLORE::cb_explore,_example> *plVar5;
  code *pcVar6;
  code *pcVar7;
  size_t ws;
  ulong length;
  bool bVar8;
  free_ptr<CB_EXPLORE::cb_explore> data;
  allocator local_a74;
  allocator local_a73;
  allocator local_a72;
  allocator local_a71;
  allocator local_a70;
  allocator local_a6f;
  allocator local_a6e;
  allocator local_a6d;
  allocator local_a6c;
  allocator local_a6b;
  allocator local_a6a;
  allocator local_a69;
  string local_a68 [32];
  string local_a48;
  string local_a28 [32];
  string local_a08;
  string local_9e8 [32];
  string local_9c8;
  string local_9a8 [32];
  string local_988;
  string local_968 [32];
  string local_948;
  string local_928 [32];
  string local_908;
  string local_8e8;
  undefined1 local_8c8 [112];
  bool local_858;
  option_group_definition new_options;
  stringstream ss;
  undefined1 local_7e0 [32];
  string local_7c0 [64];
  bool local_780;
  typed_option<float> local_668;
  undefined1 local_5c8 [112];
  bool local_558;
  undefined1 local_528 [112];
  bool local_4b8;
  typed_option<float> local_488;
  typed_option<float> local_3e8;
  typed_option<unsigned_long> local_348;
  typed_option<unsigned_long> local_2a8;
  typed_option<float> local_208;
  typed_option<unsigned_long> local_168;
  typed_option<unsigned_int> local_c8;
  
  scoped_calloc_or_throw<CB_EXPLORE::cb_explore>();
  std::__cxx11::string::string
            ((string *)&local_8e8,"Contextual Bandit Exploration",(allocator *)&ss);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_8e8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::string((string *)&local_908,"cb_explore",&local_a69);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&ss,&local_908,
             &((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cbcs).
              num_actions);
  local_780 = true;
  std::__cxx11::string::string
            (local_928,"Online explore-exploit for a <k> action contextual bandit problem",
             &local_a6a);
  std::__cxx11::string::_M_assign(local_7c0);
  VW::config::typed_option<unsigned_int>::typed_option(&local_c8,(typed_option<unsigned_int> *)&ss);
  poVar2 = VW::config::option_group_definition::add<unsigned_int>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_948,"first",&local_a6b);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_8c8,&local_948,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->tau);
  local_858 = true;
  std::__cxx11::string::string(local_968,"tau-first exploration",&local_a6c);
  std::__cxx11::string::_M_assign((string *)(local_8c8 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_168,(typed_option<unsigned_long> *)local_8c8);
  poVar2 = VW::config::option_group_definition::add<unsigned_long>(poVar2,&local_168);
  std::__cxx11::string::string((string *)&local_988,"epsilon",&local_a6d);
  VW::config::typed_option<float>::typed_option
            (&local_668,&local_988,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->epsilon);
  local_668.super_base_option.m_keep = true;
  ptVar3 = VW::config::typed_option<float>::default_value(&local_668,0.05);
  std::__cxx11::string::string(local_9a8,"epsilon-greedy exploration",&local_a6e);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_208,ptVar3);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_208);
  std::__cxx11::string::string((string *)&local_9c8,"bag",&local_a6f);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_5c8,&local_9c8,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->bag_size);
  local_558 = true;
  std::__cxx11::string::string(local_9e8,"bagging-based exploration",&local_a70);
  std::__cxx11::string::_M_assign((string *)(local_5c8 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2a8,(typed_option<unsigned_long> *)local_5c8);
  poVar2 = VW::config::option_group_definition::add<unsigned_long>(poVar2,&local_2a8);
  std::__cxx11::string::string((string *)&local_a08,"cover",&local_a71);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_528,&local_a08,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_size);
  local_4b8 = true;
  std::__cxx11::string::string(local_a28,"Online cover based exploration",&local_a72);
  std::__cxx11::string::_M_assign((string *)(local_528 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_348,(typed_option<unsigned_long> *)local_528);
  poVar2 = VW::config::option_group_definition::add<unsigned_long>(poVar2,&local_348);
  std::__cxx11::string::string((string *)&local_a48,"psi",&local_a73);
  VW::config::typed_option<float>::typed_option
            (&local_488,&local_a48,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->psi);
  local_488.super_base_option.m_keep = true;
  ptVar3 = VW::config::typed_option<float>::default_value(&local_488,1.0);
  std::__cxx11::string::string(local_a68,"disagreement parameter for cover",&local_a74);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3e8,ptVar3);
  VW::config::option_group_definition::add<float>(poVar2,&local_3e8);
  VW::config::typed_option<float>::~typed_option(&local_3e8);
  std::__cxx11::string::~string(local_a68);
  VW::config::typed_option<float>::~typed_option(&local_488);
  std::__cxx11::string::~string((string *)&local_a48);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_a28);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_528);
  std::__cxx11::string::~string((string *)&local_a08);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_9e8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_5c8);
  std::__cxx11::string::~string((string *)&local_9c8);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_9a8);
  VW::config::typed_option<float>::~typed_option(&local_668);
  std::__cxx11::string::~string((string *)&local_988);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_968);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_8c8);
  std::__cxx11::string::~string((string *)&local_948);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_928);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&ss);
  std::__cxx11::string::~string((string *)&local_908);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&ss,"cb_explore",(allocator *)local_8c8);
  iVar1 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar1 == '\0') {
    plVar5 = (learner<CB_EXPLORE::cb_explore,_example> *)0x0;
    goto LAB_001ec7c2;
  }
  (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
   super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->all = all;
  length = (ulong)((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cbcs).
                  num_actions;
  std::__cxx11::string::string((string *)&ss,"cb",(allocator *)local_8c8);
  iVar1 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar1 == '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::_M_insert<unsigned_long>((ulong)local_7e0);
    std::__cxx11::string::string((string *)local_8c8,"cb",(allocator *)local_5c8);
    std::__cxx11::stringbuf::str();
    (*options->_vptr_options_i[5])(options,local_8c8,&local_668);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)local_8c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  all->delete_prediction = ACTION_SCORE::delete_action_scores;
  ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cbcs).cb_type = 0;
  l = setup_base(options,all);
  base = LEARNER::as_singleline<char,char>(l);
  ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cbcs).scorer = all->scorer
  ;
  std::__cxx11::string::string((string *)&ss,"cover",(allocator *)local_8c8);
  iVar1 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string((string *)&ss,"bag",(allocator *)local_8c8);
    iVar1 = (*options->_vptr_options_i[1])(options,&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((char)iVar1 != '\0') {
      ws = (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->bag_size;
      pcVar6 = CB_EXPLORE::predict_or_learn_bag<false>;
      pcVar7 = CB_EXPLORE::predict_or_learn_bag<true>;
      goto LAB_001ec701;
    }
    std::__cxx11::string::string((string *)&ss,"first",(allocator *)local_8c8);
    iVar1 = (*options->_vptr_options_i[1])(options,&ss);
    std::__cxx11::string::~string((string *)&ss);
    pcVar6 = CB_EXPLORE::predict_or_learn_greedy<true>;
    bVar8 = (char)iVar1 != '\0';
    if (bVar8) {
      pcVar6 = CB_EXPLORE::predict_or_learn_first<true>;
    }
    pcVar7 = CB_EXPLORE::predict_or_learn_greedy<false>;
    if (bVar8) {
      pcVar7 = CB_EXPLORE::predict_or_learn_first<false>;
    }
    plVar5 = LEARNER::learner<CB_EXPLORE::cb_explore,example>::
             init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>.
                        _M_t.super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl,base,
                        pcVar6,pcVar7,1,action_probs);
  }
  else {
    psVar4 = LEARNER::as_singleline<char,char>(all->cost_sensitive);
    (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cs =
         (learner<CB_EXPLORE::cb_explore,_example> *)psVar4;
    v_array<COST_SENSITIVE::wclass>::resize
              (&((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->
                second_cs_label).costs,length);
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->second_cs_label).costs.
    _end = ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->second_cs_label).
           costs._begin + length;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs)._begin =
         (float *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs)._end =
         (float *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs).end_array =
         (float *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs).erase_count
         = 0;
    v_array<float>::resize
              (&(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_probs,
               length);
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds).end_array =
         (uint *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds).erase_count = 0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds)._begin =
         (uint *)0x0;
    ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds)._end =
         (uint *)0x0;
    v_array<unsigned_int>::resize
              (&(data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->preds,
               (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_size);
    ws = (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl)->cover_size + 1;
    pcVar6 = CB_EXPLORE::predict_or_learn_cover<false>;
    pcVar7 = CB_EXPLORE::predict_or_learn_cover<true>;
LAB_001ec701:
    plVar5 = LEARNER::learner<CB_EXPLORE::cb_explore,example>::
             init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>.
                        _M_t.super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl,base,
                        pcVar7,pcVar6,ws,action_probs);
  }
  data._M_t.super___uniq_ptr_impl<CB_EXPLORE::cb_explore,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CB_EXPLORE::cb_explore_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CB_EXPLORE::cb_explore_*,_false>._M_head_impl = (cb_explore *)0x0;
  *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
  *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
  *(code **)(plVar5 + 200) = CB_EXPLORE::finish;
  *(undefined8 *)(plVar5 + 0x58) = *(undefined8 *)(plVar5 + 0x18);
  *(code **)(plVar5 + 0x68) = CB_EXPLORE::finish_example;
LAB_001ec7c2:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar5;
}

Assistant:

base_learner* cb_explore_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore>();
  option_group_definition new_options("Contextual Bandit Exploration");
  new_options
      .add(make_option("cb_explore", data->cbcs.num_actions)
               .keep()
               .help("Online explore-exploit for a <k> action contextual bandit problem"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().default_value(0.05f).help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb_explore"))
    return nullptr;

  data->all = &all;
  uint32_t num_actions = data->cbcs.num_actions;

  if (!options.was_supplied("cb"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("cb", ss.str());
  }

  all.delete_prediction = delete_action_scores;
  data->cbcs.cb_type = CB_TYPE_DR;

  single_learner* base = as_singleline(setup_base(options, all));
  data->cbcs.scorer = all.scorer;

  learner<cb_explore, example>* l;
  if (options.was_supplied("cover"))
  {
    data->cs = (learner<cb_explore, example>*)(as_singleline(all.cost_sensitive));
    data->second_cs_label.costs.resize(num_actions);
    data->second_cs_label.costs.end() = data->second_cs_label.costs.begin() + num_actions;
    data->cover_probs = v_init<float>();
    data->cover_probs.resize(num_actions);
    data->preds = v_init<uint32_t>();
    data->preds.resize(data->cover_size);
    l = &init_learner(data, base, predict_or_learn_cover<true>, predict_or_learn_cover<false>, data->cover_size + 1,
        prediction_type::action_probs);
  }
  else if (options.was_supplied("bag"))
    l = &init_learner(data, base, predict_or_learn_bag<true>, predict_or_learn_bag<false>, data->bag_size,
        prediction_type::action_probs);
  else if (options.was_supplied("first"))
    l = &init_learner(
        data, base, predict_or_learn_first<true>, predict_or_learn_first<false>, 1, prediction_type::action_probs);
  else  // greedy
    l = &init_learner(
        data, base, predict_or_learn_greedy<true>, predict_or_learn_greedy<false>, 1, prediction_type::action_probs);

  l->set_finish(finish);
  l->set_finish_example(finish_example);
  return make_base(*l);
}